

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

Object * env_get(Object *__return_storage_ptr__,char *identifer,int line,Environment *env)

{
  Record *pRVar1;
  Record *get;
  Environment *env_local;
  int line_local;
  char *identifer_local;
  
  pRVar1 = env_match(identifer,env);
  if (pRVar1 == (Record *)0x0) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Undefined variable %s!\x1b[0m",(ulong)(uint)line,
           identifer);
    stop();
  }
  memcpy(__return_storage_ptr__,&pRVar1->object,0x40);
  return __return_storage_ptr__;
}

Assistant:

Object env_get(char *identifer, int line, Environment *env){
    Record *get = env_match(identifer, env);
    if(get == NULL){
        printf(runtime_error("Undefined variable %s!"), line, identifer);
        stop();
    }
   // else if(get->object.type == OBJECT_ARRAY){
   //     printf(runtime_error("%s is an array and cannot be accessed directly!"), line, identifer);
   //     stop();
   // }
    return get->object;
}